

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O1

CURLcode file_do(connectdata *conn,_Bool *done)

{
  SessionHandle *pSVar1;
  SessionHandle *pSVar2;
  undefined8 *puVar3;
  bool bVar4;
  _Bool _Var5;
  int iVar6;
  CURLcode CVar7;
  int iVar8;
  int iVar9;
  CURLcode CVar10;
  char *pcVar11;
  curl_off_t cVar12;
  long lVar13;
  ushort **ppuVar14;
  __off64_t _Var15;
  size_t sVar16;
  long lVar17;
  size_t sVar18;
  undefined8 uVar19;
  byte bVar20;
  ulong uVar21;
  char *pcVar22;
  size_t __n;
  long lVar23;
  timeval tVar24;
  long local_118;
  tm buffer;
  char *ptr2;
  stat statbuf;
  
  pSVar1 = conn->data;
  tVar24 = curlx_tvnow();
  uVar21 = tVar24.tv_sec;
  *done = true;
  Curl_initinfo(pSVar1);
  Curl_pgrsStartNow(pSVar1);
  pSVar2 = conn->data;
  puVar3 = (undefined8 *)(pSVar2->req).protop;
  if ((pSVar1->set).upload != true) {
    iVar6 = *(int *)(puVar3 + 2);
    iVar8 = fstat64(iVar6,(stat64 *)&statbuf);
    cVar12 = statbuf.st_size;
    if (iVar8 == -1) {
      cVar12 = 0;
    }
    else {
      (pSVar1->info).filetime = statbuf.st_mtim.tv_sec;
      if ((((pSVar1->state).range == (char *)0x0) &&
          ((pSVar1->set).timecondition != CURL_TIMECOND_NONE)) &&
         (_Var5 = Curl_meets_timecondition(pSVar1,(pSVar1->info).filetime), !_Var5)) {
        *done = true;
        return CURLE_OK;
      }
    }
    pcVar22 = (pSVar1->state).buffer;
    if ((((pSVar1->set).opt_no_body == true) && (iVar8 != -1)) &&
       ((pSVar1->set).include_header != false)) {
      curl_msnprintf(pcVar22,0x4001,"Content-Length: %ld\r\n");
      CVar7 = Curl_client_write(conn,3,pcVar22,0);
      if (CVar7 != CURLE_OK) {
        return CVar7;
      }
      CVar7 = Curl_client_write(conn,3,"Accept-ranges: bytes\r\n",0);
      if (CVar7 != CURLE_OK) {
        return CVar7;
      }
      CVar10 = Curl_gmtime(statbuf.st_mtim.tv_sec,&buffer);
      CVar7 = CVar10;
      if (CVar10 == CURLE_OK) {
        iVar6 = 6;
        if (buffer.tm_wday != 0) {
          iVar6 = buffer.tm_wday + -1;
        }
        curl_msnprintf(pcVar22,0x3fff,"Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
                       Curl_wkday[iVar6],(ulong)(uint)buffer.tm_mday,Curl_month[buffer.tm_mon],
                       (ulong)(buffer.tm_year + 0x76c),(ulong)(uint)buffer.tm_hour,
                       (ulong)buffer._0_8_ >> 0x20,buffer._0_8_ & 0xffffffff);
        CVar7 = Curl_client_write(conn,3,pcVar22,0);
      }
      if (CVar10 != CURLE_OK) {
        return CVar10;
      }
      Curl_pgrsSetDownloadSize(pSVar1,cVar12);
      return CVar7;
    }
    pSVar2 = conn->data;
    lVar23 = -1;
    lVar13 = 0x88;
    if (((pSVar2->state).use_range == true) &&
       (pcVar11 = (pSVar2->state).range, pcVar11 != (char *)0x0)) {
      lVar23 = strtol(pcVar11,(char **)&buffer,0);
      bVar20 = *(byte *)buffer._0_8_;
      pcVar11 = (char *)buffer._0_8_;
      if (bVar20 != 0) {
        ppuVar14 = __ctype_b_loc();
        do {
          if ((bVar20 != 0x2d) && (((*ppuVar14)[bVar20] & 0x2000) == 0)) break;
          bVar20 = pcVar11[1];
          pcVar11 = pcVar11 + 1;
        } while (bVar20 != 0);
      }
      buffer._0_8_ = pcVar11;
      lVar13 = strtol(pcVar11,&ptr2,0);
      lVar17 = -1;
      if (pcVar11 != ptr2) {
        lVar17 = lVar13;
      }
      lVar13 = 0x8a50;
      if (lVar17 != -1 || lVar23 < 0) {
        lVar17 = (lVar17 - lVar23) + 1;
        if (lVar23 < 0) {
          lVar17 = -lVar23;
        }
        (pSVar2->req).maxdownload = lVar17;
      }
    }
    *(long *)((long)pSVar2->sockets + lVar13 + -0x38) = lVar23;
    lVar23 = (pSVar1->state).resume_from;
    if (lVar23 < 0) {
      if (iVar8 == -1) {
        Curl_failf(pSVar1,"Can\'t get the size of file.");
        return CURLE_READ_ERROR;
      }
      (pSVar1->state).resume_from = lVar23 + statbuf.st_size;
    }
    lVar23 = (pSVar1->state).resume_from;
    if (cVar12 < lVar23) {
      Curl_failf(pSVar1,"failed to resume file:// transfer");
      return CURLE_BAD_DOWNLOAD_RESUME;
    }
    lVar13 = (pSVar1->req).maxdownload;
    lVar23 = cVar12 - lVar23;
    if (0 < lVar13) {
      lVar23 = lVar13;
    }
    if ((iVar8 != -1) && (uVar21 = 0, lVar23 == 0)) {
      return CURLE_OK;
    }
    if (iVar8 != -1) {
      Curl_pgrsSetDownloadSize(pSVar1,lVar23);
    }
    lVar13 = (pSVar1->state).resume_from;
    if (lVar13 != 0) {
      _Var15 = lseek64(iVar6,lVar13,0);
      uVar21 = 0x24;
      if (lVar13 != _Var15) {
        return CURLE_BAD_DOWNLOAD_RESUME;
      }
    }
    Curl_pgrsTime(pSVar1,TIMER_STARTTRANSFER);
    lVar13 = 0;
    CVar7 = CURLE_OK;
    do {
      if (CVar7 != CURLE_OK) goto LAB_00587eef;
      sVar18 = 0x3fff;
      if (lVar23 < 0x3fff) {
        sVar18 = curlx_sotouz(lVar23);
      }
      sVar18 = read(iVar6,pcVar22,sVar18);
      if (0 < (long)sVar18) {
        pcVar22[sVar18] = '\0';
      }
      iVar8 = 3;
      if ((0 < (long)sVar18) && (lVar23 != 0)) {
        lVar13 = lVar13 + sVar18;
        lVar23 = lVar23 - sVar18;
        iVar8 = 1;
        CVar7 = Curl_client_write(conn,1,pcVar22,sVar18);
        if (CVar7 == CURLE_OK) {
          Curl_pgrsSetDownloadCounter(pSVar1,lVar13);
          iVar9 = Curl_pgrsUpdate(conn);
          CVar7 = CURLE_ABORTED_BY_CALLBACK;
          iVar8 = 0;
          if (iVar9 == 0) {
            CVar7 = Curl_speedcheck(pSVar1,tVar24);
          }
        }
        else {
          uVar21 = (ulong)CVar7;
        }
      }
    } while (iVar8 == 0);
    if (iVar8 != 3) {
      return (CURLcode)uVar21;
    }
LAB_00587eef:
    iVar6 = Curl_pgrsUpdate(conn);
    if (iVar6 != 0) {
      return CURLE_ABORTED_BY_CALLBACK;
    }
    return CVar7;
  }
  pcVar11 = strchr((char *)*puVar3,0x2f);
  pcVar22 = (pSVar2->state).buffer;
  tVar24 = curlx_tvnow();
  pSVar1 = conn->data;
  (pSVar1->req).upload_fromhere = pcVar22;
  if (pcVar11 == (char *)0x0) {
    return CURLE_FILE_COULDNT_READ_FILE;
  }
  if (pcVar11[1] == '\0') {
    return CURLE_FILE_COULDNT_READ_FILE;
  }
  iVar6 = open64((char *)*puVar3,(uint)((pSVar2->state).resume_from != 0) * 0x200 + 0x241,
                 (pSVar1->set).new_file_perms);
  if (iVar6 < 0) {
    uVar19 = *puVar3;
    pcVar22 = "Can\'t open %s for writing";
LAB_00587f84:
    Curl_failf(pSVar2,pcVar22,uVar19);
    CVar7 = CURLE_WRITE_ERROR;
  }
  else {
    lVar23 = (pSVar2->state).infilesize;
    if (lVar23 != -1) {
      Curl_pgrsSetUploadSize(pSVar2,lVar23);
    }
    if ((pSVar2->state).resume_from < 0) {
      iVar8 = fstat64(iVar6,(stat64 *)&statbuf);
      if (iVar8 != 0) {
        close(iVar6);
        uVar19 = *puVar3;
        pcVar22 = "Can\'t get the size of %s";
        goto LAB_00587f84;
      }
      (pSVar2->state).resume_from = statbuf.st_size;
    }
    CVar7 = CURLE_OK;
    local_118 = 0;
    do {
      if (CVar7 != CURLE_OK) break;
      CVar7 = Curl_fillreadbuffer(conn,0x4000,&buffer.tm_sec);
      if (CVar7 == CURLE_OK) {
        __n = (size_t)buffer.tm_sec;
        CVar7 = CURLE_OK;
        if (0 < (long)__n) {
          lVar23 = (pSVar2->state).resume_from;
          pcVar11 = pcVar22;
          if (lVar23 != 0) {
            lVar13 = 0;
            if (lVar23 < (long)__n) {
              lVar13 = lVar23;
            }
            sVar16 = -(lVar23 - __n);
            cVar12 = lVar23 - __n;
            if (lVar23 < (long)__n) {
              cVar12 = 0;
            }
            else {
              sVar16 = 0;
            }
            (pSVar2->state).resume_from = cVar12;
            pcVar11 = pcVar22 + lVar13;
            __n = sVar16;
          }
          sVar16 = write(iVar6,pcVar11,__n);
          if (sVar16 == __n) {
            local_118 = local_118 + __n;
            Curl_pgrsSetUploadCounter(pSVar2,local_118);
            iVar8 = Curl_pgrsUpdate(conn);
            bVar4 = true;
            CVar7 = CURLE_ABORTED_BY_CALLBACK;
            if (iVar8 == 0) {
              CVar7 = Curl_speedcheck(pSVar2,tVar24);
            }
            goto LAB_00587b69;
          }
          CVar7 = CURLE_SEND_ERROR;
        }
        bVar4 = false;
      }
      else {
        bVar4 = false;
      }
LAB_00587b69:
    } while (bVar4);
    if (CVar7 == CURLE_OK) {
      iVar8 = Curl_pgrsUpdate(conn);
      CVar7 = CURLE_ABORTED_BY_CALLBACK;
      if (iVar8 == 0) {
        CVar7 = CURLE_OK;
      }
    }
    close(iVar6);
  }
  return CVar7;
}

Assistant:

static CURLcode file_do(struct connectdata *conn, bool *done)
{
  /* This implementation ignores the host name in conformance with
     RFC 1738. Only local files (reachable via the standard file system)
     are supported. This means that files on remotely mounted directories
     (via NFS, Samba, NT sharing) can be accessed through a file:// URL
  */
  CURLcode result = CURLE_OK;
  struct_stat statbuf; /* struct_stat instead of struct stat just to allow the
                          Windows version to have a different struct without
                          having to redefine the simple word 'stat' */
  curl_off_t expected_size=0;
  bool fstated=FALSE;
  ssize_t nread;
  struct SessionHandle *data = conn->data;
  char *buf = data->state.buffer;
  curl_off_t bytecount = 0;
  int fd;
  struct timeval now = Curl_tvnow();
  struct FILEPROTO *file;

  *done = TRUE; /* unconditionally */

  Curl_initinfo(data);
  Curl_pgrsStartNow(data);

  if(data->set.upload)
    return file_upload(conn);

  file = conn->data->req.protop;

  /* get the fd from the connection phase */
  fd = file->fd;

  /* VMS: This only works reliable for STREAMLF files */
  if(-1 != fstat(fd, &statbuf)) {
    /* we could stat it, then read out the size */
    expected_size = statbuf.st_size;
    /* and store the modification time */
    data->info.filetime = (long)statbuf.st_mtime;
    fstated = TRUE;
  }

  if(fstated && !data->state.range && data->set.timecondition) {
    if(!Curl_meets_timecondition(data, (time_t)data->info.filetime)) {
      *done = TRUE;
      return CURLE_OK;
    }
  }

  /* If we have selected NOBODY and HEADER, it means that we only want file
     information. Which for FILE can't be much more than the file size and
     date. */
  if(data->set.opt_no_body && data->set.include_header && fstated) {
    snprintf(buf, sizeof(data->state.buffer),
             "Content-Length: %" CURL_FORMAT_CURL_OFF_T "\r\n", expected_size);
    result = Curl_client_write(conn, CLIENTWRITE_BOTH, buf, 0);
    if(result)
      return result;

    result = Curl_client_write(conn, CLIENTWRITE_BOTH,
                               (char *)"Accept-ranges: bytes\r\n", 0);
    if(result)
      return result;

    if(fstated) {
      time_t filetime = (time_t)statbuf.st_mtime;
      struct tm buffer;
      const struct tm *tm = &buffer;
      result = Curl_gmtime(filetime, &buffer);
      if(result)
        return result;

      /* format: "Tue, 15 Nov 1994 12:45:26 GMT" */
      snprintf(buf, BUFSIZE-1,
               "Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
               Curl_wkday[tm->tm_wday?tm->tm_wday-1:6],
               tm->tm_mday,
               Curl_month[tm->tm_mon],
               tm->tm_year + 1900,
               tm->tm_hour,
               tm->tm_min,
               tm->tm_sec);
      result = Curl_client_write(conn, CLIENTWRITE_BOTH, buf, 0);
    }
    /* if we fstat()ed the file, set the file size to make it available post-
       transfer */
    if(fstated)
      Curl_pgrsSetDownloadSize(data, expected_size);
    return result;
  }

  /* Check whether file range has been specified */
  file_range(conn);

  /* Adjust the start offset in case we want to get the N last bytes
   * of the stream iff the filesize could be determined */
  if(data->state.resume_from < 0) {
    if(!fstated) {
      failf(data, "Can't get the size of file.");
      return CURLE_READ_ERROR;
    }
    else
      data->state.resume_from += (curl_off_t)statbuf.st_size;
  }

  if(data->state.resume_from <= expected_size)
    expected_size -= data->state.resume_from;
  else {
    failf(data, "failed to resume file:// transfer");
    return CURLE_BAD_DOWNLOAD_RESUME;
  }

  /* A high water mark has been specified so we obey... */
  if(data->req.maxdownload > 0)
    expected_size = data->req.maxdownload;

  if(fstated && (expected_size == 0))
    return CURLE_OK;

  /* The following is a shortcut implementation of file reading
     this is both more efficient than the former call to download() and
     it avoids problems with select() and recv() on file descriptors
     in Winsock */
  if(fstated)
    Curl_pgrsSetDownloadSize(data, expected_size);

  if(data->state.resume_from) {
    if(data->state.resume_from !=
       lseek(fd, data->state.resume_from, SEEK_SET))
      return CURLE_BAD_DOWNLOAD_RESUME;
  }

  Curl_pgrsTime(data, TIMER_STARTTRANSFER);

  while(!result) {
    /* Don't fill a whole buffer if we want less than all data */
    size_t bytestoread =
      (expected_size < CURL_OFF_T_C(BUFSIZE) - CURL_OFF_T_C(1)) ?
      curlx_sotouz(expected_size) : BUFSIZE - 1;

    nread = read(fd, buf, bytestoread);

    if(nread > 0)
      buf[nread] = 0;

    if(nread <= 0 || expected_size == 0)
      break;

    bytecount += nread;
    expected_size -= nread;

    result = Curl_client_write(conn, CLIENTWRITE_BODY, buf, nread);
    if(result)
      return result;

    Curl_pgrsSetDownloadCounter(data, bytecount);

    if(Curl_pgrsUpdate(conn))
      result = CURLE_ABORTED_BY_CALLBACK;
    else
      result = Curl_speedcheck(data, now);
  }
  if(Curl_pgrsUpdate(conn))
    result = CURLE_ABORTED_BY_CALLBACK;

  return result;
}